

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_129::checkEnumList<capnp::DynamicValue::Builder>
          (anon_unknown_129 *this,Builder *reader,initializer_list<const_char_*> expected)

{
  char *a;
  bool bVar1;
  iterator ppcVar2;
  uint index;
  iterator ppcVar3;
  BuilderFor<DynamicEnum> BVar4;
  DynamicEnum e;
  DynamicEnum e_00;
  ArrayPtr<const_char> local_c0;
  ListElementCount local_ac;
  Fault f;
  BuilderFor<capnp::DynamicList> list;
  
  ppcVar2 = expected._M_array;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&list,(Builder *)this);
  if ((iterator)(ulong)list.builder.elementCount == ppcVar2) {
    for (index = 0; ppcVar3 = (iterator)(ulong)index, ppcVar3 < ppcVar2; index = index + 1) {
      a = *(char **)(&reader->type + (long)ppcVar3 * 2);
      DynamicList::Builder::operator[]((Builder *)&f,&list,index);
      BVar4 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                        ((Builder *)&f);
      e._8_8_ = BVar4._8_8_;
      e.schema.super_Schema.raw._4_4_ = 0;
      e.schema.super_Schema.raw._0_4_ = BVar4._8_4_;
      local_c0 = (ArrayPtr<const_char>)
                 name((anon_unknown_129 *)BVar4.schema.super_Schema.raw.super_Schema,e);
      bVar1 = kj::operator==(a,(StringPtr *)&local_c0);
      DynamicValue::Builder::~Builder((Builder *)&f);
      if (!bVar1 && kj::_::Debug::minSeverity < 3) {
        DynamicList::Builder::operator[]((Builder *)&f,&list,index);
        BVar4 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                          ((Builder *)&f);
        e_00._8_8_ = BVar4._8_8_;
        e_00.schema.super_Schema.raw._4_4_ = 0;
        e_00.schema.super_Schema.raw._0_4_ = BVar4._8_4_;
        local_c0 = (ArrayPtr<const_char>)
                   name((anon_unknown_129 *)BVar4.schema.super_Schema.raw.super_Schema,e_00);
        kj::_::Debug::log<char_const(&)[85],char_const*const&,capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x14c,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                   ,(char (*) [85])
                    "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                   ,(char **)(&reader->type + (long)ppcVar3 * 2),(Reader *)&local_c0);
        DynamicValue::Builder::~Builder((Builder *)&f);
      }
    }
    return;
  }
  local_c0.ptr = (char *)ppcVar2;
  local_ac = list.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x14a,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
             (unsigned_long *)&local_c0,&local_ac);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}